

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O1

bool __thiscall IceCore::Container::Delete(Container *this,udword entry)

{
  uint uVar1;
  udword *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  uVar1 = this->mCurNbEntries;
  bVar6 = uVar1 != 0;
  if (bVar6) {
    puVar2 = this->mEntries;
    if (*puVar2 == entry) {
      lVar4 = 0;
    }
    else {
      lVar5 = 0;
      do {
        if (uVar1 - 1 == (int)lVar5) {
          return false;
        }
        lVar4 = lVar5 + 1;
        lVar3 = lVar5 + 1;
        lVar5 = lVar4;
      } while (puVar2[lVar3] != entry);
      bVar6 = (uint)lVar4 < uVar1;
    }
    this->mCurNbEntries = uVar1 - 1;
    puVar2[lVar4] = puVar2[uVar1 - 1];
  }
  return bVar6;
}

Assistant:

bool Container::Delete(udword entry)
{
	// Look for the entry
	for(udword i=0;i<mCurNbEntries;i++)
	{
		if(mEntries[i]==entry)
		{
			// Entry has been found at index i. The strategy is to copy the last current entry at index i, and decrement the current number of entries.
			DeleteIndex(i);
			return true;
		}
	}
	return false;
}